

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ThreadState.cpp
# Opt level: O2

size_t __thiscall axl::spy::ThreadState::removeFrame(ThreadState *this,size_t frameBase)

{
  IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
  it_00;
  size_t sVar1;
  Ret RVar2;
  RbTreeIterator<unsigned_long,_axl::spy::ThreadState::Frame> it;
  Entry *local_28;
  
  it_00.m_p = (Entry *)sl::
                       BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
                       ::find(&(this->m_frameMap).
                               super_BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
                              ,frameBase);
  if ((IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
       )it_00.m_p ==
      (IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
       )0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = ((it_00.m_p)->
            super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
            ).super_MapEntry<unsigned_long,_axl::spy::ThreadState::Frame>.m_value.m_ret.
            m_originalRet;
    local_28 = it_00.m_p;
    cleanup(this,(EVP_PKEY_CTX *)&local_28);
    if (((it_00.m_p)->
        super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
        ).super_MapEntry<unsigned_long,_axl::spy::ThreadState::Frame>.m_value.m_chainedRetStack.
        super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
        .m_count == 0) {
      sl::
      BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
      ::erase(&(this->m_frameMap).
               super_BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
              ,(Iterator)it_00.m_p);
    }
    else {
      RVar2 = sl::
              Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
              ::getBackAndPop(&((it_00.m_p)->
                               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                               ).super_MapEntry<unsigned_long,_axl::spy::ThreadState::Frame>.m_value
                               .m_chainedRetStack);
      ((it_00.m_p)->
      super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
      ).super_MapEntry<unsigned_long,_axl::spy::ThreadState::Frame>.m_value.m_ret = RVar2;
    }
  }
  return sVar1;
}

Assistant:

size_t
ThreadState::removeFrame(size_t frameBase) {
	sl::RbTreeIterator<size_t, Frame> it = findFrame(frameBase);
	if (!it) {
		ASSERT(false && "protolesshooks: FATAL ERROR: return address not found");
		return 0;
	}

	size_t originalRet = it->m_value.m_ret.m_originalRet;
	cleanup(it);

	if (!it->m_value.m_chainedRetStack.isEmpty())
		it->m_value.m_ret = it->m_value.m_chainedRetStack.getBackAndPop();
	else
		m_frameMap.erase(it);

	return originalRet;
}